

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* cxxopts::values::parser_tool::SplitSwitchDef
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *text)

{
  char *__s;
  size_t sVar1;
  pointer psVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 auStack_48 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_48 = (undefined1  [8])0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  __s = (text->_M_dataplus)._M_p;
  sVar1 = strlen(__s);
  std::__detail::
  __regex_algo_impl<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
            (__s,__s + sVar1,
             (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> *
             )auStack_48,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  if ((ulong)(((long)result.
                     super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 3) *
             -0x5555555555555555) < 4) {
    throw_or_mimic<cxxopts::invalid_option_format_error>(text);
  }
  if (auStack_48 ==
      (undefined1  [8])
      result.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = false;
  }
  else {
    bVar3 = ((long)result.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 3) *
            -0x5555555555555555 - 6U < 0xfffffffffffffffd;
  }
  psVar2 = result.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start + -3;
  if (bVar3) {
    psVar2 = (pointer)((long)auStack_48 + 0x30);
  }
  if (psVar2->matched == true) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,(psVar2->super_pair<const_char_*,_const_char_*>).first,
               (psVar2->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
  }
  if (auStack_48 ==
      (undefined1  [8])
      result.
      super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = false;
  }
  else {
    bVar3 = ((long)result.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 3) *
            -0x5555555555555555 - 7U < 0xfffffffffffffffc;
  }
  psVar2 = result.
           super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           .
           super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start + -3;
  if (bVar3) {
    psVar2 = (pointer)((long)auStack_48 + 0x48);
  }
  if (psVar2->matched == true) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,(psVar2->super_pair<const_char_*,_const_char_*>).first,
               (psVar2->super_pair<const_char_*,_const_char_*>).second);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)result.
                          super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string> SplitSwitchDef(const std::string &text)
      {
        std::match_results<const char*> result;
        std::regex_match(text.c_str(), result, option_specifier);
        if (result.empty())
        {
          throw_or_mimic<invalid_option_format_error>(text);
        }

        const std::string& short_sw = result[2];
        const std::string& long_sw = result[3];

        return std::pair<std::string, std::string>(short_sw, long_sw);
      }